

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O2

void tinyformat::detail::formatImpl(ostream *out,char *fmt,FormatArg *args,int numArgs)

{
  undefined4 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  ostream oVar4;
  char *fmtStart;
  long lVar5;
  format_error *pfVar6;
  size_type sVar7;
  long in_FS_OFFSET;
  int ntrunc;
  bool spacePadPositive;
  int argIndex;
  bool positionalMode;
  string result;
  ostringstream tmpStream;
  uint auStack_198 [88];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar5 = *(long *)(*(long *)out + -0x18);
  uVar2 = *(undefined8 *)(out + lVar5 + 8);
  uVar3 = *(undefined8 *)(out + lVar5 + 0x10);
  uVar1 = *(undefined4 *)(out + lVar5 + 0x18);
  oVar4 = (ostream)std::ios::fill();
  positionalMode = false;
  argIndex = 0;
  do {
    fmtStart = printFormatStringLiteral(out,fmt);
    if (*fmtStart == '\0') {
      if ((positionalMode == false) && (argIndex < numArgs)) {
        pfVar6 = (format_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&tmpStream,
                   "tinyformat: Not enough conversion specifiers in format string",
                   (allocator<char> *)&result);
        format_error::format_error(pfVar6,(string *)&tmpStream);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pfVar6,&format_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      else {
        lVar5 = *(long *)out;
        *(undefined8 *)(out + *(long *)(lVar5 + -0x18) + 0x10) = uVar3;
        *(undefined8 *)(out + *(long *)(lVar5 + -0x18) + 8) = uVar2;
        *(undefined4 *)(out + *(long *)(lVar5 + -0x18) + 0x18) = uVar1;
        lVar5 = *(long *)(lVar5 + -0x18);
        std::ios::fill();
        out[lVar5 + 0xe0] = oVar4;
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          return;
        }
      }
LAB_0010c048:
      __stack_chk_fail();
    }
    spacePadPositive = false;
    ntrunc = -1;
    fmt = streamStateFromFormat
                    (out,&positionalMode,&spacePadPositive,&ntrunc,fmtStart,args,&argIndex,numArgs);
    lVar5 = (long)argIndex;
    if (numArgs <= argIndex) {
      pfVar6 = (format_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&tmpStream,"tinyformat: Too many conversion specifiers in format string",
                 (allocator<char> *)&result);
      format_error::format_error(pfVar6,(string *)&tmpStream);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(pfVar6,&format_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_0010c048;
    }
    if (spacePadPositive == false) {
      FormatArg::format(args + lVar5,out,fmtStart,fmt,ntrunc);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&tmpStream);
      std::ios::copyfmt((ios *)((ostringstream *)&tmpStream + *(long *)(_tmpStream + -0x18)));
      *(uint *)((long)auStack_198 + *(long *)(_tmpStream + -0x18)) =
           *(uint *)((long)auStack_198 + *(long *)(_tmpStream + -0x18)) | 0x800;
      FormatArg::format(args + lVar5,(ostream *)&tmpStream,fmtStart,fmt,ntrunc);
      std::__cxx11::stringbuf::str();
      for (sVar7 = 0; result._M_string_length != sVar7; sVar7 = sVar7 + 1) {
        if (result._M_dataplus._M_p[sVar7] == '+') {
          result._M_dataplus._M_p[sVar7] = ' ';
        }
      }
      std::operator<<(out,(string *)&result);
      std::__cxx11::string::~string((string *)&result);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tmpStream);
    }
    if (positionalMode == false) {
      argIndex = argIndex + 1;
    }
  } while( true );
}

Assistant:

inline void formatImpl(std::ostream& out, const char* fmt,
                       const detail::FormatArg* args,
                       int numArgs)
{
    // Saved stream state
    std::streamsize origWidth = out.width();
    std::streamsize origPrecision = out.precision();
    std::ios::fmtflags origFlags = out.flags();
    char origFill = out.fill();

    // "Positional mode" means all format specs should be of the form "%n$..."
    // with `n` an integer. We detect this in `streamStateFromFormat`.
    bool positionalMode = false;
    int argIndex = 0;
    while (true) {
        fmt = printFormatStringLiteral(out, fmt);
        if (*fmt == '\0') {
            if (!positionalMode && argIndex < numArgs) {
                TINYFORMAT_ERROR("tinyformat: Not enough conversion specifiers in format string");
            }
            break;
        }
        bool spacePadPositive = false;
        int ntrunc = -1;
        const char* fmtEnd = streamStateFromFormat(out, positionalMode, spacePadPositive, ntrunc, fmt,
                                                   args, argIndex, numArgs);
        // NB: argIndex may be incremented by reading variable width/precision
        // in `streamStateFromFormat`, so do the bounds check here.
        if (argIndex >= numArgs) {
            TINYFORMAT_ERROR("tinyformat: Too many conversion specifiers in format string");
            return;
        }
        const FormatArg& arg = args[argIndex];
        // Format the arg into the stream.
        if (!spacePadPositive) {
            arg.format(out, fmt, fmtEnd, ntrunc);
        }
        else {
            // The following is a special case with no direct correspondence
            // between stream formatting and the printf() behaviour.  Simulate
            // it crudely by formatting into a temporary string stream and
            // munging the resulting string.
            std::ostringstream tmpStream;
            tmpStream.copyfmt(out);
            tmpStream.setf(std::ios::showpos);
            arg.format(tmpStream, fmt, fmtEnd, ntrunc);
            std::string result = tmpStream.str(); // allocates... yuck.
            for (size_t i = 0, iend = result.size(); i < iend; ++i) {
                if (result[i] == '+')
                    result[i] = ' ';
            }
            out << result;
        }
        if (!positionalMode)
            ++argIndex;
        fmt = fmtEnd;
    }

    // Restore stream state
    out.width(origWidth);
    out.precision(origPrecision);
    out.flags(origFlags);
    out.fill(origFill);
}